

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlChar * xmlEncodeEntitiesInternal(xmlDocPtr doc,xmlChar *input,int attr)

{
  xmlDocPtr pxVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  xmlChar *pxVar8;
  long lVar9;
  uint uVar10;
  byte *pbVar11;
  long lVar12;
  undefined8 unaff_R12;
  size_t sVar13;
  char buf [11];
  byte local_47;
  byte local_46 [9];
  undefined1 local_3d;
  uint local_3c;
  xmlDocPtr local_38;
  
  if (input == (xmlChar *)0x0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    if (doc == (xmlDocPtr)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (uint)CONCAT71((int7)((ulong)unaff_R12 >> 8),doc->type == XML_HTML_DOCUMENT_NODE);
    }
    pbVar4 = (byte *)(*xmlMalloc)(1000);
    if (pbVar4 == (byte *)0x0) {
      pbVar4 = (byte *)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlEncodeEntities: malloc failed");
    }
    else {
      bVar3 = *input;
      pbVar11 = pbVar4;
      if (bVar3 != 0) {
        bVar2 = attr != 0 & (byte)uVar10;
        sVar13 = 1000;
        local_3c = uVar10;
        local_38 = doc;
        do {
          if (sVar13 < ((long)pbVar11 - (long)pbVar4) + 100U) {
            if ((long)sVar13 < 0) {
LAB_00146980:
              __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlEncodeEntities: realloc failed");
              (*xmlFree)(pbVar4);
              return (xmlChar *)0x0;
            }
            sVar13 = sVar13 * 2;
            pbVar5 = (byte *)(*xmlRealloc)(pbVar4,sVar13);
            if (pbVar5 == (byte *)0x0) goto LAB_00146980;
            pbVar11 = pbVar5 + ((long)pbVar11 - (long)pbVar4);
            bVar3 = *input;
            pbVar4 = pbVar5;
          }
          if (bVar3 == 0x26) {
            if (((bVar2 == 0) || (input[1] != 0x7b)) ||
               (pcVar7 = strchr((char *)input,0x7d), pcVar7 == (char *)0x0)) {
              pbVar11[0] = 0x26;
              pbVar11[1] = 0x61;
              pbVar11[2] = 0x6d;
              pbVar11[3] = 0x70;
              pbVar11[4] = 0x3b;
              pbVar11 = pbVar11 + 5;
              goto LAB_0014668f;
            }
            input = input + 1;
            bVar3 = 0x26;
            do {
              *pbVar11 = bVar3;
              pbVar11 = pbVar11 + 1;
              if (sVar13 < ((long)pbVar11 - (long)pbVar4) + 100U) {
                if ((long)sVar13 < 0) goto LAB_00146980;
                sVar13 = sVar13 * 2;
                pbVar5 = (byte *)(*xmlRealloc)(pbVar4,sVar13);
                if (pbVar5 == (byte *)0x0) goto LAB_00146980;
                pbVar11 = pbVar5 + ((long)pbVar11 - (long)pbVar4);
                pbVar4 = pbVar5;
              }
              bVar3 = *input;
              input = input + 1;
            } while (bVar3 != 0x7d);
            *pbVar11 = 0x7d;
            pbVar11 = pbVar11 + 1;
          }
          else {
            uVar10 = (uint)bVar3;
            if (uVar10 == 0x3e) {
              pbVar11[0] = 0x26;
              pbVar11[1] = 0x67;
              pbVar11[2] = 0x74;
              pbVar11[3] = 0x3b;
            }
            else {
              if (uVar10 != 0x3c) {
                if (('\x1f' < (char)bVar3) ||
                   ((byte)(bVar3 == 0xd & (byte)local_3c | (byte)(bVar3 - 9) < 2) == 1))
                goto LAB_0014666a;
                if (-1 < (char)bVar3) {
                  if ((bVar3 < 0xe) && ((0x2600U >> (uVar10 & 0x1f) & 1) != 0)) {
                    snprintf((char *)&local_47,0xb,"&#%d;");
                    local_3d = 0;
                    if (local_47 != 0) {
                      pbVar5 = local_46;
                      bVar3 = local_47;
                      do {
                        *pbVar11 = bVar3;
                        pbVar11 = pbVar11 + 1;
                        bVar3 = *pbVar5;
                        pbVar5 = pbVar5 + 1;
                      } while (bVar3 != 0);
                    }
                  }
                  goto LAB_0014668f;
                }
                if (local_38 == (xmlDocPtr)0x0) {
                  if ((byte)local_3c != 0) goto LAB_0014666a;
                  if (0xbf < bVar3) goto LAB_001467e1;
                  __xmlSimpleError(2,0x13a8,(xmlNodePtr)0x0,"xmlEncodeEntities: input not UTF-8",
                                   (char *)0x0);
LAB_00146777:
                  snprintf((char *)&local_47,0xb,"&#%d;");
                  local_3d = 0;
                  lVar12 = 1;
                  if (local_47 != 0) {
                    pbVar5 = local_46;
                    bVar3 = local_47;
                    do {
                      *pbVar11 = bVar3;
                      pbVar11 = pbVar11 + 1;
                      bVar3 = *pbVar5;
                      pbVar5 = pbVar5 + 1;
                    } while (bVar3 != 0);
                  }
                }
                else {
                  if (local_38->encoding != (xmlChar *)0x0 || (local_3c & 1) != 0) {
LAB_0014666a:
                    *pbVar11 = bVar3;
                    pbVar11 = pbVar11 + 1;
                    goto LAB_0014668f;
                  }
                  if (bVar3 < 0xc0) {
                    __xmlSimpleError(2,0x13a8,(xmlNodePtr)0x0,"xmlEncodeEntities: input not UTF-8",
                                     (char *)0x0);
                    pxVar8 = xmlStrdup((xmlChar *)"ISO-8859-1");
                    local_38->encoding = pxVar8;
                    goto LAB_00146777;
                  }
LAB_001467e1:
                  if (bVar3 < 0xe0) {
                    uVar10 = (uVar10 & 0x1f) << 6;
                    lVar12 = 2;
                    lVar9 = 1;
LAB_0014684e:
                    uVar10 = input[lVar9] & 0x3f | uVar10;
                    if (uVar10 < 0x100) {
                      if ((uVar10 < 0x20) &&
                         ((0xd < uVar10 || ((0x2600U >> (input[lVar9] & 0x1f) & 1) == 0))))
                      goto LAB_001468e4;
                    }
                    else if (0xfffff < uVar10 - 0x10000 &&
                             (0x1ffd < uVar10 - 0xe000 && 0xd7ff < uVar10)) goto LAB_001468e4;
                    snprintf((char *)&local_47,0xb,"&#x%X;");
                    local_3d = 0;
                    if (local_47 != 0) {
                      pbVar5 = local_46;
                      bVar3 = local_47;
                      do {
                        *pbVar11 = bVar3;
                        pbVar11 = pbVar11 + 1;
                        bVar3 = *pbVar5;
                        pbVar5 = pbVar5 + 1;
                      } while (bVar3 != 0);
                    }
                  }
                  else {
                    if (bVar3 < 0xf0) {
                      uVar10 = (input[1] & 0x3f | (uVar10 & 0xf) << 6) << 6;
                      lVar12 = 3;
                      lVar9 = 2;
                      goto LAB_0014684e;
                    }
                    if (bVar3 < 0xf8) {
                      uVar10 = (input[2] & 0x3f) << 6 | (input[1] & 0x3f | (uVar10 & 7) << 6) << 0xc
                      ;
                      lVar12 = 4;
                      lVar9 = 3;
                      goto LAB_0014684e;
                    }
LAB_001468e4:
                    __xmlSimpleError(2,9,(xmlNodePtr)0x0,"xmlEncodeEntities: char out of range\n",
                                     (char *)0x0);
                    pxVar1 = local_38;
                    if (local_38 != (xmlDocPtr)0x0) {
                      pxVar8 = xmlStrdup((xmlChar *)"ISO-8859-1");
                      pxVar1->encoding = pxVar8;
                    }
                    snprintf((char *)&local_47,0xb,"&#%d;");
                    local_3d = 0;
                    lVar12 = 1;
                    if (local_47 != 0) {
                      pbVar5 = local_46;
                      bVar3 = local_47;
                      do {
                        *pbVar11 = bVar3;
                        pbVar11 = pbVar11 + 1;
                        bVar3 = *pbVar5;
                        pbVar5 = pbVar5 + 1;
                      } while (bVar3 != 0);
                    }
                  }
                }
                local_3d = 0;
                input = input + lVar12;
                goto LAB_00146692;
              }
              if ((((bVar2 != 0) && (input[1] == 0x21)) && (input[2] == 0x2d)) &&
                 ((input[3] == 0x2d && (pbVar5 = xmlStrstr(input,"-->"), pbVar5 != (byte *)0x0)))) {
                for (; input != pbVar5; input = input + 1) {
                  *pbVar11 = *input;
                  pbVar11 = pbVar11 + 1;
                  pbVar6 = pbVar4;
                  if (sVar13 < ((long)pbVar11 - (long)pbVar4) + 100U) {
                    if ((long)sVar13 < 0) goto LAB_00146980;
                    sVar13 = sVar13 * 2;
                    pbVar6 = (byte *)(*xmlRealloc)(pbVar4,sVar13);
                    if (pbVar6 == (byte *)0x0) goto LAB_00146980;
                    pbVar11 = pbVar6 + ((long)pbVar11 - (long)pbVar4);
                  }
                  pbVar4 = pbVar6;
                }
                *pbVar11 = *input;
                pbVar11[1] = input[1];
                pbVar5 = input + 2;
                input = input + 3;
                pbVar11[2] = *pbVar5;
                pbVar11 = pbVar11 + 3;
                goto LAB_00146692;
              }
              pbVar11[0] = 0x26;
              pbVar11[1] = 0x6c;
              pbVar11[2] = 0x74;
              pbVar11[3] = 0x3b;
            }
            pbVar11 = pbVar11 + 4;
LAB_0014668f:
            input = input + 1;
          }
LAB_00146692:
          bVar3 = *input;
        } while (bVar3 != 0);
      }
      *pbVar11 = 0;
    }
  }
  return pbVar4;
}

Assistant:

static xmlChar *
xmlEncodeEntitiesInternal(xmlDocPtr doc, const xmlChar *input, int attr) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    int html = 0;

    if (input == NULL) return(NULL);
    if (doc != NULL)
        html = (doc->type == XML_HTML_DOCUMENT_NODE);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size * sizeof(xmlChar));
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeEntities: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 100 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    const xmlChar *end;

	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if (html && attr &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
	        while (cur != end) {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		*out++ = *cur++;
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if (html && attr && (cur[1] == '{') &&
	        (strchr((const char *) cur, '}'))) {
	        while (*cur != '}') {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (((*cur >= 0x20) && (*cur < 0x80)) ||
	    (*cur == '\n') || (*cur == '\t') || ((html) && (*cur == '\r'))) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *cur;
	} else if (*cur >= 0x80) {
	    if (((doc != NULL) && (doc->encoding != NULL)) || (html)) {
		/*
		 * Bjørn Reese <br@sseusa.com> provided the patch
	        xmlChar xc;
	        xc = (*cur & 0x3F) << 6;
	        if (cur[1] != 0) {
		    xc += *(++cur) & 0x3F;
		    *out++ = xc;
	        } else
		 */
		*out++ = *cur;
	    } else {
		/*
		 * We assume we have UTF-8 input.
		 */
		char buf[11], *ptr;
		int val = 0, l = 1;

		if (*cur < 0xC0) {
		    xmlEntitiesErr(XML_CHECK_NOT_UTF8,
			    "xmlEncodeEntities: input not UTF-8");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		} else if (*cur < 0xE0) {
                    val = (cur[0]) & 0x1F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    l = 2;
		} else if (*cur < 0xF0) {
                    val = (cur[0]) & 0x0F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    l = 3;
		} else if (*cur < 0xF8) {
                    val = (cur[0]) & 0x07;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    val <<= 6;
		    val |= (cur[3]) & 0x3F;
		    l = 4;
		}
		if ((l == 1) || (!IS_CHAR(val))) {
		    xmlEntitiesErr(XML_ERR_INVALID_CHAR,
			"xmlEncodeEntities: char out of range\n");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		}
		/*
		 * We could do multiple things here. Just save as a char ref
		 */
		snprintf(buf, sizeof(buf), "&#x%X;", val);
		buf[sizeof(buf) - 1] = 0;
		ptr = buf;
		while (*ptr != 0) *out++ = *ptr++;
		cur += l;
		continue;
	    }
	} else if (IS_BYTE_CHAR(*cur)) {
	    char buf[11], *ptr;

	    snprintf(buf, sizeof(buf), "&#%d;", *cur);
	    buf[sizeof(buf) - 1] = 0;
            ptr = buf;
	    while (*ptr != 0) *out++ = *ptr++;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeEntities: realloc failed");
    xmlFree(buffer);
    return(NULL);
}